

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# source.cpp
# Opt level: O0

bool anon_unknown.dwarf_41b5d::GetSourcedv
               (ALsource *Source,ALCcontext *Context,SourceProp prop,
               span<double,_18446744073709551615UL> values)

{
  float fVar1;
  span<int,_18446744073709551615UL> values_00;
  reference pvVar2;
  rep rVar3;
  reference pvVar4;
  index_type iVar5;
  reference pdVar6;
  uint in_EDX;
  ALCcontext *in_RSI;
  float *in_RDI;
  bool bVar7;
  double dVar8;
  nanoseconds latency;
  nanoseconds diff;
  lock_guard<std::mutex> _;
  bool err;
  int ivals [6];
  nanoseconds srcclock;
  ClockLatency clocktime;
  ALCdevice *device;
  mutex_type *in_stack_fffffffffffffc58;
  ALCdevice *in_stack_fffffffffffffc60;
  duration<long,_std::ratio<1L,_1000000000L>_> *in_stack_fffffffffffffc68;
  undefined4 in_stack_fffffffffffffc70;
  undefined4 in_stack_fffffffffffffc74;
  duration<long,_std::ratio<1L,_1000000000L>_> *in_stack_fffffffffffffc78;
  nanoseconds *in_stack_fffffffffffffcd8;
  ALCcontext *in_stack_fffffffffffffce0;
  undefined4 in_stack_fffffffffffffce8;
  undefined4 in_stack_fffffffffffffcec;
  ALCcontext *in_stack_fffffffffffffd08;
  ALenum in_stack_fffffffffffffd14;
  ALsource *in_stack_fffffffffffffd18;
  SourceProp in_stack_ffffffffffffff0c;
  ALCcontext *in_stack_ffffffffffffff10;
  ALsource *in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff24;
  pointer in_stack_ffffffffffffff28;
  span<int,_18446744073709551615UL> local_b8;
  duration<long,_std::ratio<1L,_1000000000L>_> local_a8;
  rep local_a0;
  ClockLatency local_88;
  byte local_69;
  int local_68 [6];
  duration<long,_std::ratio<1L,_1000000000L>_> local_50;
  ClockLatency local_48;
  ALCdevice *local_38;
  uint local_2c;
  ALCcontext *local_28;
  float *local_20;
  span<double,_18446744073709551615UL> local_18;
  bool local_1;
  
  local_2c = in_EDX;
  local_28 = in_RSI;
  local_20 = in_RDI;
  local_38 = al::intrusive_ptr<ALCdevice>::get(&in_RSI->mDevice);
  if (local_2c != 0x202) {
    if (local_2c == 0x1001) {
      iVar5 = al::span<double,_18446744073709551615UL>::size(&local_18);
      bVar7 = true;
      if (iVar5 != 1) {
        iVar5 = al::span<double,_18446744073709551615UL>::size(&local_18);
        bVar7 = iVar5 == 6;
      }
      if (!bVar7) {
        iVar5 = al::span<double,_18446744073709551615UL>::size(&local_18);
        ALCcontext::setError
                  (local_28,0xa002,"Property 0x%04x expects %d value(s), got %zu",(ulong)local_2c,1,
                   iVar5);
        return false;
      }
      fVar1 = local_20[5];
      pdVar6 = al::span<double,_18446744073709551615UL>::operator[](&local_18,0);
      *pdVar6 = (double)fVar1;
      return true;
    }
    if (local_2c == 0x1002) {
      iVar5 = al::span<double,_18446744073709551615UL>::size(&local_18);
      bVar7 = true;
      if (iVar5 != 1) {
        iVar5 = al::span<double,_18446744073709551615UL>::size(&local_18);
        bVar7 = iVar5 == 6;
      }
      if (!bVar7) {
        iVar5 = al::span<double,_18446744073709551615UL>::size(&local_18);
        ALCcontext::setError
                  (local_28,0xa002,"Property 0x%04x expects %d value(s), got %zu",(ulong)local_2c,1,
                   iVar5);
        return false;
      }
      fVar1 = local_20[6];
      pdVar6 = al::span<double,_18446744073709551615UL>::operator[](&local_18,0);
      *pdVar6 = (double)fVar1;
      return true;
    }
    if (local_2c == 0x1003) {
      iVar5 = al::span<double,_18446744073709551615UL>::size(&local_18);
      bVar7 = true;
      if (iVar5 != 1) {
        iVar5 = al::span<double,_18446744073709551615UL>::size(&local_18);
        bVar7 = iVar5 == 6;
      }
      if (!bVar7) {
        iVar5 = al::span<double,_18446744073709551615UL>::size(&local_18);
        ALCcontext::setError
                  (local_28,0xa002,"Property 0x%04x expects %d value(s), got %zu",(ulong)local_2c,1,
                   iVar5);
        return false;
      }
      dVar8 = (double)*local_20;
      pdVar6 = al::span<double,_18446744073709551615UL>::operator[](&local_18,0);
      *pdVar6 = dVar8;
      return true;
    }
    if (local_2c == 0x1004) {
      iVar5 = al::span<double,_18446744073709551615UL>::size(&local_18);
      bVar7 = true;
      if (iVar5 != 3) {
        iVar5 = al::span<double,_18446744073709551615UL>::size(&local_18);
        bVar7 = iVar5 == 6;
      }
      if (!bVar7) {
        iVar5 = al::span<double,_18446744073709551615UL>::size(&local_18);
        ALCcontext::setError
                  (local_28,0xa002,"Property 0x%04x expects %d value(s), got %zu",(ulong)local_2c,3,
                   iVar5);
        return false;
      }
      pvVar4 = std::array<float,_3UL>::operator[]
                         ((array<float,_3UL> *)in_stack_fffffffffffffc60,
                          (size_type)in_stack_fffffffffffffc58);
      dVar8 = (double)*pvVar4;
      pdVar6 = al::span<double,_18446744073709551615UL>::operator[](&local_18,0);
      *pdVar6 = dVar8;
      pvVar4 = std::array<float,_3UL>::operator[]
                         ((array<float,_3UL> *)in_stack_fffffffffffffc60,
                          (size_type)in_stack_fffffffffffffc58);
      fVar1 = *pvVar4;
      pdVar6 = al::span<double,_18446744073709551615UL>::operator[](&local_18,1);
      *pdVar6 = (double)fVar1;
      pvVar4 = std::array<float,_3UL>::operator[]
                         ((array<float,_3UL> *)in_stack_fffffffffffffc60,
                          (size_type)in_stack_fffffffffffffc58);
      fVar1 = *pvVar4;
      pdVar6 = al::span<double,_18446744073709551615UL>::operator[](&local_18,2);
      *pdVar6 = (double)fVar1;
      return true;
    }
    if (local_2c == 0x1005) {
      iVar5 = al::span<double,_18446744073709551615UL>::size(&local_18);
      bVar7 = true;
      if (iVar5 != 3) {
        iVar5 = al::span<double,_18446744073709551615UL>::size(&local_18);
        bVar7 = iVar5 == 6;
      }
      if (!bVar7) {
        iVar5 = al::span<double,_18446744073709551615UL>::size(&local_18);
        ALCcontext::setError
                  (local_28,0xa002,"Property 0x%04x expects %d value(s), got %zu",(ulong)local_2c,3,
                   iVar5);
        return false;
      }
      pvVar4 = std::array<float,_3UL>::operator[]
                         ((array<float,_3UL> *)in_stack_fffffffffffffc60,
                          (size_type)in_stack_fffffffffffffc58);
      fVar1 = *pvVar4;
      pdVar6 = al::span<double,_18446744073709551615UL>::operator[](&local_18,0);
      *pdVar6 = (double)fVar1;
      pvVar4 = std::array<float,_3UL>::operator[]
                         ((array<float,_3UL> *)in_stack_fffffffffffffc60,
                          (size_type)in_stack_fffffffffffffc58);
      fVar1 = *pvVar4;
      pdVar6 = al::span<double,_18446744073709551615UL>::operator[](&local_18,1);
      *pdVar6 = (double)fVar1;
      pvVar4 = std::array<float,_3UL>::operator[]
                         ((array<float,_3UL> *)in_stack_fffffffffffffc60,
                          (size_type)in_stack_fffffffffffffc58);
      dVar8 = (double)*pvVar4;
      pdVar6 = al::span<double,_18446744073709551615UL>::operator[](&local_18,2);
      *pdVar6 = dVar8;
      return true;
    }
    if (local_2c == 0x1006) {
      iVar5 = al::span<double,_18446744073709551615UL>::size(&local_18);
      bVar7 = true;
      if (iVar5 != 3) {
        iVar5 = al::span<double,_18446744073709551615UL>::size(&local_18);
        bVar7 = iVar5 == 6;
      }
      if (!bVar7) {
        iVar5 = al::span<double,_18446744073709551615UL>::size(&local_18);
        ALCcontext::setError
                  (local_28,0xa002,"Property 0x%04x expects %d value(s), got %zu",(ulong)local_2c,3,
                   iVar5);
        return false;
      }
      pvVar4 = std::array<float,_3UL>::operator[]
                         ((array<float,_3UL> *)in_stack_fffffffffffffc60,
                          (size_type)in_stack_fffffffffffffc58);
      fVar1 = *pvVar4;
      pdVar6 = al::span<double,_18446744073709551615UL>::operator[](&local_18,0);
      *pdVar6 = (double)fVar1;
      pvVar4 = std::array<float,_3UL>::operator[]
                         ((array<float,_3UL> *)in_stack_fffffffffffffc60,
                          (size_type)in_stack_fffffffffffffc58);
      fVar1 = *pvVar4;
      pdVar6 = al::span<double,_18446744073709551615UL>::operator[](&local_18,1);
      *pdVar6 = (double)fVar1;
      pvVar4 = std::array<float,_3UL>::operator[]
                         ((array<float,_3UL> *)in_stack_fffffffffffffc60,
                          (size_type)in_stack_fffffffffffffc58);
      fVar1 = *pvVar4;
      pdVar6 = al::span<double,_18446744073709551615UL>::operator[](&local_18,2);
      *pdVar6 = (double)fVar1;
      return true;
    }
    if (local_2c != 0x1007) {
      if (local_2c == 0x1009) goto LAB_0016848d;
      if (local_2c == 0x100a) {
        iVar5 = al::span<double,_18446744073709551615UL>::size(&local_18);
        bVar7 = true;
        if (iVar5 != 1) {
          iVar5 = al::span<double,_18446744073709551615UL>::size(&local_18);
          bVar7 = iVar5 == 6;
        }
        if (!bVar7) {
          iVar5 = al::span<double,_18446744073709551615UL>::size(&local_18);
          ALCcontext::setError
                    (local_28,0xa002,"Property 0x%04x expects %d value(s), got %zu",(ulong)local_2c,
                     1,iVar5);
          return false;
        }
        dVar8 = (double)local_20[1];
        pdVar6 = al::span<double,_18446744073709551615UL>::operator[](&local_18,0);
        *pdVar6 = dVar8;
        return true;
      }
      if (local_2c == 0x100d) {
        iVar5 = al::span<double,_18446744073709551615UL>::size(&local_18);
        bVar7 = true;
        if (iVar5 != 1) {
          iVar5 = al::span<double,_18446744073709551615UL>::size(&local_18);
          bVar7 = iVar5 == 6;
        }
        if (!bVar7) {
          iVar5 = al::span<double,_18446744073709551615UL>::size(&local_18);
          ALCcontext::setError
                    (local_28,0xa002,"Property 0x%04x expects %d value(s), got %zu",(ulong)local_2c,
                     1,iVar5);
          return false;
        }
        fVar1 = local_20[3];
        pdVar6 = al::span<double,_18446744073709551615UL>::operator[](&local_18,0);
        *pdVar6 = (double)fVar1;
        return true;
      }
      if (local_2c == 0x100e) {
        iVar5 = al::span<double,_18446744073709551615UL>::size(&local_18);
        bVar7 = true;
        if (iVar5 != 1) {
          iVar5 = al::span<double,_18446744073709551615UL>::size(&local_18);
          bVar7 = iVar5 == 6;
        }
        if (!bVar7) {
          iVar5 = al::span<double,_18446744073709551615UL>::size(&local_18);
          ALCcontext::setError
                    (local_28,0xa002,"Property 0x%04x expects %d value(s), got %zu",(ulong)local_2c,
                     1,iVar5);
          return false;
        }
        dVar8 = (double)local_20[4];
        pdVar6 = al::span<double,_18446744073709551615UL>::operator[](&local_18,0);
        *pdVar6 = dVar8;
        return true;
      }
      if (local_2c == 0x100f) {
        iVar5 = al::span<double,_18446744073709551615UL>::size(&local_18);
        bVar7 = true;
        if (iVar5 != 6) {
          iVar5 = al::span<double,_18446744073709551615UL>::size(&local_18);
          bVar7 = iVar5 == 6;
        }
        if (!bVar7) {
          iVar5 = al::span<double,_18446744073709551615UL>::size(&local_18);
          ALCcontext::setError
                    (local_28,0xa002,"Property 0x%04x expects %d value(s), got %zu",(ulong)local_2c,
                     6,iVar5);
          return false;
        }
        pvVar4 = std::array<float,_3UL>::operator[]
                           ((array<float,_3UL> *)in_stack_fffffffffffffc60,
                            (size_type)in_stack_fffffffffffffc58);
        fVar1 = *pvVar4;
        pdVar6 = al::span<double,_18446744073709551615UL>::operator[](&local_18,0);
        *pdVar6 = (double)fVar1;
        pvVar4 = std::array<float,_3UL>::operator[]
                           ((array<float,_3UL> *)in_stack_fffffffffffffc60,
                            (size_type)in_stack_fffffffffffffc58);
        fVar1 = *pvVar4;
        pdVar6 = al::span<double,_18446744073709551615UL>::operator[](&local_18,1);
        *pdVar6 = (double)fVar1;
        pvVar4 = std::array<float,_3UL>::operator[]
                           ((array<float,_3UL> *)in_stack_fffffffffffffc60,
                            (size_type)in_stack_fffffffffffffc58);
        fVar1 = *pvVar4;
        pdVar6 = al::span<double,_18446744073709551615UL>::operator[](&local_18,2);
        *pdVar6 = (double)fVar1;
        pvVar4 = std::array<float,_3UL>::operator[]
                           ((array<float,_3UL> *)in_stack_fffffffffffffc60,
                            (size_type)in_stack_fffffffffffffc58);
        fVar1 = *pvVar4;
        pdVar6 = al::span<double,_18446744073709551615UL>::operator[](&local_18,3);
        *pdVar6 = (double)fVar1;
        pvVar4 = std::array<float,_3UL>::operator[]
                           ((array<float,_3UL> *)in_stack_fffffffffffffc60,
                            (size_type)in_stack_fffffffffffffc58);
        fVar1 = *pvVar4;
        pdVar6 = al::span<double,_18446744073709551615UL>::operator[](&local_18,4);
        *pdVar6 = (double)fVar1;
        pvVar4 = std::array<float,_3UL>::operator[]
                           ((array<float,_3UL> *)in_stack_fffffffffffffc60,
                            (size_type)in_stack_fffffffffffffc58);
        fVar1 = *pvVar4;
        pdVar6 = al::span<double,_18446744073709551615UL>::operator[](&local_18,5);
        *pdVar6 = (double)fVar1;
        return true;
      }
      if ((local_2c != 0x1010) && (1 < local_2c - 0x1015)) {
        if (local_2c == 0x1020) {
          iVar5 = al::span<double,_18446744073709551615UL>::size(&local_18);
          bVar7 = true;
          if (iVar5 != 1) {
            iVar5 = al::span<double,_18446744073709551615UL>::size(&local_18);
            bVar7 = iVar5 == 6;
          }
          if (!bVar7) {
            iVar5 = al::span<double,_18446744073709551615UL>::size(&local_18);
            ALCcontext::setError
                      (local_28,0xa002,"Property 0x%04x expects %d value(s), got %zu",
                       (ulong)local_2c,1,iVar5);
            return false;
          }
          fVar1 = local_20[7];
          pdVar6 = al::span<double,_18446744073709551615UL>::operator[](&local_18,0);
          *pdVar6 = (double)fVar1;
          return true;
        }
        if (local_2c == 0x1021) {
          iVar5 = al::span<double,_18446744073709551615UL>::size(&local_18);
          bVar7 = true;
          if (iVar5 != 1) {
            iVar5 = al::span<double,_18446744073709551615UL>::size(&local_18);
            bVar7 = iVar5 == 6;
          }
          if (!bVar7) {
            iVar5 = al::span<double,_18446744073709551615UL>::size(&local_18);
            ALCcontext::setError
                      (local_28,0xa002,"Property 0x%04x expects %d value(s), got %zu",
                       (ulong)local_2c,1,iVar5);
            return false;
          }
          fVar1 = local_20[9];
          pdVar6 = al::span<double,_18446744073709551615UL>::operator[](&local_18,0);
          *pdVar6 = (double)fVar1;
          return true;
        }
        if (local_2c == 0x1022) {
          iVar5 = al::span<double,_18446744073709551615UL>::size(&local_18);
          bVar7 = true;
          if (iVar5 != 1) {
            iVar5 = al::span<double,_18446744073709551615UL>::size(&local_18);
            bVar7 = iVar5 == 6;
          }
          if (!bVar7) {
            iVar5 = al::span<double,_18446744073709551615UL>::size(&local_18);
            ALCcontext::setError
                      (local_28,0xa002,"Property 0x%04x expects %d value(s), got %zu",
                       (ulong)local_2c,1,iVar5);
            return false;
          }
          fVar1 = local_20[2];
          pdVar6 = al::span<double,_18446744073709551615UL>::operator[](&local_18,0);
          *pdVar6 = (double)fVar1;
          return true;
        }
        if (local_2c == 0x1023) {
          iVar5 = al::span<double,_18446744073709551615UL>::size(&local_18);
          bVar7 = true;
          if (iVar5 != 1) {
            iVar5 = al::span<double,_18446744073709551615UL>::size(&local_18);
            bVar7 = iVar5 == 6;
          }
          if (!bVar7) {
            iVar5 = al::span<double,_18446744073709551615UL>::size(&local_18);
            ALCcontext::setError
                      (local_28,0xa002,"Property 0x%04x expects %d value(s), got %zu",
                       (ulong)local_2c,1,iVar5);
            return false;
          }
          fVar1 = local_20[8];
          pdVar6 = al::span<double,_18446744073709551615UL>::operator[](&local_18,0);
          *pdVar6 = (double)fVar1;
          return true;
        }
        if (local_2c - 0x1024 < 3) {
          iVar5 = al::span<double,_18446744073709551615UL>::size(&local_18);
          bVar7 = true;
          if (iVar5 != 1) {
            iVar5 = al::span<double,_18446744073709551615UL>::size(&local_18);
            bVar7 = iVar5 == 6;
          }
          if (!bVar7) {
            iVar5 = al::span<double,_18446744073709551615UL>::size(&local_18);
            ALCcontext::setError
                      (local_28,0xa002,"Property 0x%04x expects %d value(s), got %zu",
                       (ulong)local_2c,1,iVar5);
            return false;
          }
          dVar8 = GetSourceOffset(in_stack_fffffffffffffd18,in_stack_fffffffffffffd14,
                                  in_stack_fffffffffffffd08);
          pdVar6 = al::span<double,_18446744073709551615UL>::operator[](&local_18,0);
          *pdVar6 = dVar8;
          return true;
        }
        if (local_2c != 0x1027) {
          if (local_2c == 0x1030) {
            iVar5 = al::span<double,_18446744073709551615UL>::size(&local_18);
            bVar7 = true;
            if (iVar5 != 2) {
              iVar5 = al::span<double,_18446744073709551615UL>::size(&local_18);
              bVar7 = iVar5 == 6;
            }
            if (!bVar7) {
              iVar5 = al::span<double,_18446744073709551615UL>::size(&local_18);
              ALCcontext::setError
                        (local_28,0xa002,"Property 0x%04x expects %d value(s), got %zu",
                         (ulong)local_2c,2,iVar5);
              return false;
            }
            pvVar2 = std::array<float,_2UL>::operator[]
                               ((array<float,_2UL> *)in_stack_fffffffffffffc60,
                                (size_type)in_stack_fffffffffffffc58);
            fVar1 = *pvVar2;
            pdVar6 = al::span<double,_18446744073709551615UL>::operator[](&local_18,0);
            *pdVar6 = (double)fVar1;
            pvVar2 = std::array<float,_2UL>::operator[]
                               ((array<float,_2UL> *)in_stack_fffffffffffffc60,
                                (size_type)in_stack_fffffffffffffc58);
            fVar1 = *pvVar2;
            pdVar6 = al::span<double,_18446744073709551615UL>::operator[](&local_18,1);
            *pdVar6 = (double)fVar1;
            return true;
          }
          if (local_2c == 0x1031) {
            iVar5 = al::span<double,_18446744073709551615UL>::size(&local_18);
            bVar7 = true;
            if (iVar5 != 1) {
              iVar5 = al::span<double,_18446744073709551615UL>::size(&local_18);
              bVar7 = iVar5 == 6;
            }
            if (!bVar7) {
              iVar5 = al::span<double,_18446744073709551615UL>::size(&local_18);
              ALCcontext::setError
                        (local_28,0xa002,"Property 0x%04x expects %d value(s), got %zu",
                         (ulong)local_2c,1,iVar5);
              return false;
            }
            fVar1 = local_20[0x24];
            pdVar6 = al::span<double,_18446744073709551615UL>::operator[](&local_18,0);
            *pdVar6 = (double)fVar1;
            return true;
          }
          if (local_2c != 0x1033) {
            if (local_2c != 0x1200) {
              if (local_2c == 0x1201) {
                iVar5 = al::span<double,_18446744073709551615UL>::size(&local_18);
                bVar7 = true;
                if (iVar5 != 2) {
                  iVar5 = al::span<double,_18446744073709551615UL>::size(&local_18);
                  bVar7 = iVar5 == 6;
                }
                if (!bVar7) {
                  iVar5 = al::span<double,_18446744073709551615UL>::size(&local_18);
                  ALCcontext::setError
                            (local_28,0xa002,"Property 0x%04x expects %d value(s), got %zu",
                             (ulong)local_2c,2,iVar5);
                  return false;
                }
                dVar8 = GetSourceSecOffset((ALsource *)
                                           CONCAT44(in_stack_fffffffffffffcec,
                                                    in_stack_fffffffffffffce8),
                                           in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
                pdVar6 = al::span<double,_18446744073709551615UL>::operator[](&local_18,0);
                *pdVar6 = dVar8;
                std::lock_guard<std::mutex>::lock_guard
                          ((lock_guard<std::mutex> *)in_stack_fffffffffffffc60,
                           in_stack_fffffffffffffc58);
                local_88 = GetClockLatency(in_stack_fffffffffffffc60);
                local_48 = local_88;
                std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x1679e4);
                bVar7 = std::chrono::operator==
                                  ((duration<long,_std::ratio<1L,_1000000000L>_> *)
                                   CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70),
                                   in_stack_fffffffffffffc68);
                if (bVar7) {
                  rVar3 = std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::count
                                    (&local_48.Latency);
                  pdVar6 = al::span<double,_18446744073709551615UL>::operator[](&local_18,1);
                  *pdVar6 = (double)rVar3 / 1000000000.0;
                }
                else {
                  local_a0 = (rep)std::chrono::operator-
                                            (in_stack_fffffffffffffc78,
                                             (duration<long,_std::ratio<1L,_1000000000L>_> *)
                                             CONCAT44(in_stack_fffffffffffffc74,
                                                      in_stack_fffffffffffffc70));
                  std::min<std::chrono::duration<long,std::ratio<1l,1000000000l>>>
                            ((duration<long,_std::ratio<1L,_1000000000L>_> *)
                             in_stack_fffffffffffffc58,
                             (duration<long,_std::ratio<1L,_1000000000L>_> *)0x167abe);
                  local_a8.__r = (rep)std::chrono::operator-
                                                (in_stack_fffffffffffffc78,
                                                 (duration<long,_std::ratio<1L,_1000000000L>_> *)
                                                 CONCAT44(in_stack_fffffffffffffc74,
                                                          in_stack_fffffffffffffc70));
                  rVar3 = std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::count
                                    (&local_a8);
                  pdVar6 = al::span<double,_18446744073709551615UL>::operator[](&local_18,1);
                  *pdVar6 = (double)rVar3 / 1000000000.0;
                }
                return true;
              }
              if (local_2c != 0x1202) {
                if (local_2c == 0x1203) {
                  iVar5 = al::span<double,_18446744073709551615UL>::size(&local_18);
                  bVar7 = true;
                  if (iVar5 != 2) {
                    iVar5 = al::span<double,_18446744073709551615UL>::size(&local_18);
                    bVar7 = iVar5 == 6;
                  }
                  if (!bVar7) {
                    iVar5 = al::span<double,_18446744073709551615UL>::size(&local_18);
                    ALCcontext::setError
                              (local_28,0xa002,"Property 0x%04x expects %d value(s), got %zu",
                               (ulong)local_2c,2,iVar5);
                    return false;
                  }
                  dVar8 = GetSourceSecOffset((ALsource *)
                                             CONCAT44(in_stack_fffffffffffffcec,
                                                      in_stack_fffffffffffffce8),
                                             in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
                  pdVar6 = al::span<double,_18446744073709551615UL>::operator[](&local_18,0);
                  *pdVar6 = dVar8;
                  rVar3 = std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::count
                                    (&local_50);
                  pdVar6 = al::span<double,_18446744073709551615UL>::operator[](&local_18,1);
                  *pdVar6 = (double)rVar3 / 1000000000.0;
                  return true;
                }
                if ((local_2c != 0x1212) && (local_2c != 0x1214)) {
                  if (local_2c == 0xc000) {
                    iVar5 = al::span<double,_18446744073709551615UL>::size(&local_18);
                    bVar7 = true;
                    if (iVar5 != 1) {
                      iVar5 = al::span<double,_18446744073709551615UL>::size(&local_18);
                      bVar7 = iVar5 == 6;
                    }
                    if (!bVar7) {
                      iVar5 = al::span<double,_18446744073709551615UL>::size(&local_18);
                      ALCcontext::setError
                                (local_28,0xa002,"Property 0x%04x expects %d value(s), got %zu",
                                 (ulong)local_2c,1,iVar5);
                      return false;
                    }
                    fVar1 = local_20[0x21];
                    pdVar6 = al::span<double,_18446744073709551615UL>::operator[](&local_18,0);
                    *pdVar6 = (double)fVar1;
                    return true;
                  }
                  if (local_2c != 0xd000) {
                    if (1 < local_2c - 0x20005) {
                      if (local_2c == 0x20007) {
                        iVar5 = al::span<double,_18446744073709551615UL>::size(&local_18);
                        bVar7 = true;
                        if (iVar5 != 1) {
                          iVar5 = al::span<double,_18446744073709551615UL>::size(&local_18);
                          bVar7 = iVar5 == 6;
                        }
                        if (!bVar7) {
                          iVar5 = al::span<double,_18446744073709551615UL>::size(&local_18);
                          ALCcontext::setError
                                    (local_28,0xa002,"Property 0x%04x expects %d value(s), got %zu",
                                     (ulong)local_2c,1,iVar5);
                          return false;
                        }
                        fVar1 = local_20[0x1f];
                        pdVar6 = al::span<double,_18446744073709551615UL>::operator[](&local_18,0);
                        *pdVar6 = (double)fVar1;
                        return true;
                      }
                      if (local_2c == 0x20008) {
                        iVar5 = al::span<double,_18446744073709551615UL>::size(&local_18);
                        bVar7 = true;
                        if (iVar5 != 1) {
                          iVar5 = al::span<double,_18446744073709551615UL>::size(&local_18);
                          bVar7 = iVar5 == 6;
                        }
                        if (!bVar7) {
                          iVar5 = al::span<double,_18446744073709551615UL>::size(&local_18);
                          ALCcontext::setError
                                    (local_28,0xa002,"Property 0x%04x expects %d value(s), got %zu",
                                     (ulong)local_2c,1,iVar5);
                          return false;
                        }
                        fVar1 = local_20[0x20];
                        pdVar6 = al::span<double,_18446744073709551615UL>::operator[](&local_18,0);
                        *pdVar6 = (double)fVar1;
                        return true;
                      }
                      if (local_2c == 0x20009) {
                        iVar5 = al::span<double,_18446744073709551615UL>::size(&local_18);
                        bVar7 = true;
                        if (iVar5 != 1) {
                          iVar5 = al::span<double,_18446744073709551615UL>::size(&local_18);
                          bVar7 = iVar5 == 6;
                        }
                        if (!bVar7) {
                          iVar5 = al::span<double,_18446744073709551615UL>::size(&local_18);
                          ALCcontext::setError
                                    (local_28,0xa002,"Property 0x%04x expects %d value(s), got %zu",
                                     (ulong)local_2c,1,iVar5);
                          return false;
                        }
                        fVar1 = local_20[0x1e];
                        pdVar6 = al::span<double,_18446744073709551615UL>::operator[](&local_18,0);
                        *pdVar6 = (double)fVar1;
                        return true;
                      }
                      if (local_2c - 0x2000a < 3) goto LAB_0016833c;
                    }
                    goto LAB_0016848d;
                  }
                }
                goto LAB_0016833c;
              }
            }
LAB_0016848d:
            if (0 < (int)gLogLevel) {
              fprintf((FILE *)gLogFile,"[ALSOFT] (EE) Unexpected property: 0x%04x\n",(ulong)local_2c
                     );
            }
            ALCcontext::setError
                      (local_28,0xa002,"Invalid source double property 0x%04x",(ulong)local_2c);
            return false;
          }
        }
      }
    }
  }
LAB_0016833c:
  iVar5 = al::span<double,_18446744073709551615UL>::size(&local_18);
  bVar7 = true;
  if (iVar5 != 1) {
    iVar5 = al::span<double,_18446744073709551615UL>::size(&local_18);
    bVar7 = iVar5 == 6;
  }
  if (bVar7) {
    al::span<int,_18446744073709551615UL>::span(&local_b8,local_68,1);
    values_00.mData._4_4_ = in_stack_ffffffffffffff24;
    values_00.mData._0_4_ = in_stack_ffffffffffffff20;
    values_00.mDataEnd = in_stack_ffffffffffffff28;
    local_69 = GetSourceiv(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
                           in_stack_ffffffffffffff0c,values_00);
    if ((bool)local_69) {
      dVar8 = (double)local_68[0];
      pdVar6 = al::span<double,_18446744073709551615UL>::operator[](&local_18,0);
      *pdVar6 = dVar8;
    }
    local_1 = (bool)(local_69 & 1);
  }
  else {
    iVar5 = al::span<double,_18446744073709551615UL>::size(&local_18);
    ALCcontext::setError
              (local_28,0xa002,"Property 0x%04x expects %d value(s), got %zu",(ulong)local_2c,1,
               iVar5);
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool GetSourcedv(ALsource *Source, ALCcontext *Context, SourceProp prop, const al::span<double> values)
{
    ALCdevice *device{Context->mDevice.get()};
    ClockLatency clocktime;
    nanoseconds srcclock;
    int ivals[MaxValues];
    bool err;

    switch(prop)
    {
    case AL_GAIN:
        CHECKSIZE(values, 1);
        values[0] = Source->Gain;
        return true;

    case AL_PITCH:
        CHECKSIZE(values, 1);
        values[0] = Source->Pitch;
        return true;

    case AL_MAX_DISTANCE:
        CHECKSIZE(values, 1);
        values[0] = Source->MaxDistance;
        return true;

    case AL_ROLLOFF_FACTOR:
        CHECKSIZE(values, 1);
        values[0] = Source->RolloffFactor;
        return true;

    case AL_REFERENCE_DISTANCE:
        CHECKSIZE(values, 1);
        values[0] = Source->RefDistance;
        return true;

    case AL_CONE_INNER_ANGLE:
        CHECKSIZE(values, 1);
        values[0] = Source->InnerAngle;
        return true;

    case AL_CONE_OUTER_ANGLE:
        CHECKSIZE(values, 1);
        values[0] = Source->OuterAngle;
        return true;

    case AL_MIN_GAIN:
        CHECKSIZE(values, 1);
        values[0] = Source->MinGain;
        return true;

    case AL_MAX_GAIN:
        CHECKSIZE(values, 1);
        values[0] = Source->MaxGain;
        return true;

    case AL_CONE_OUTER_GAIN:
        CHECKSIZE(values, 1);
        values[0] = Source->OuterGain;
        return true;

    case AL_SEC_OFFSET:
    case AL_SAMPLE_OFFSET:
    case AL_BYTE_OFFSET:
        CHECKSIZE(values, 1);
        values[0] = GetSourceOffset(Source, prop, Context);
        return true;

    case AL_CONE_OUTER_GAINHF:
        CHECKSIZE(values, 1);
        values[0] = Source->OuterGainHF;
        return true;

    case AL_AIR_ABSORPTION_FACTOR:
        CHECKSIZE(values, 1);
        values[0] = Source->AirAbsorptionFactor;
        return true;

    case AL_ROOM_ROLLOFF_FACTOR:
        CHECKSIZE(values, 1);
        values[0] = Source->RoomRolloffFactor;
        return true;

    case AL_DOPPLER_FACTOR:
        CHECKSIZE(values, 1);
        values[0] = Source->DopplerFactor;
        return true;

    case AL_SOURCE_RADIUS:
        CHECKSIZE(values, 1);
        values[0] = Source->Radius;
        return true;

    case AL_STEREO_ANGLES:
        CHECKSIZE(values, 2);
        values[0] = Source->StereoPan[0];
        values[1] = Source->StereoPan[1];
        return true;

    case AL_SEC_OFFSET_LATENCY_SOFT:
        CHECKSIZE(values, 2);
        /* Get the source offset with the clock time first. Then get the clock
         * time with the device latency. Order is important.
         */
        values[0] = GetSourceSecOffset(Source, Context, &srcclock);
        {
            std::lock_guard<std::mutex> _{device->StateLock};
            clocktime = GetClockLatency(device);
        }
        if(srcclock == clocktime.ClockTime)
            values[1] = static_cast<double>(clocktime.Latency.count()) / 1000000000.0;
        else
        {
            /* If the clock time incremented, reduce the latency by that much
             * since it's that much closer to the source offset it got earlier.
             */
            const nanoseconds diff{clocktime.ClockTime - srcclock};
            const nanoseconds latency{clocktime.Latency - std::min(clocktime.Latency, diff)};
            values[1] = static_cast<double>(latency.count()) / 1000000000.0;
        }
        return true;

    case AL_SEC_OFFSET_CLOCK_SOFT:
        CHECKSIZE(values, 2);
        values[0] = GetSourceSecOffset(Source, Context, &srcclock);
        values[1] = static_cast<double>(srcclock.count()) / 1000000000.0;
        return true;

    case AL_POSITION:
        CHECKSIZE(values, 3);
        values[0] = Source->Position[0];
        values[1] = Source->Position[1];
        values[2] = Source->Position[2];
        return true;

    case AL_VELOCITY:
        CHECKSIZE(values, 3);
        values[0] = Source->Velocity[0];
        values[1] = Source->Velocity[1];
        values[2] = Source->Velocity[2];
        return true;

    case AL_DIRECTION:
        CHECKSIZE(values, 3);
        values[0] = Source->Direction[0];
        values[1] = Source->Direction[1];
        values[2] = Source->Direction[2];
        return true;

    case AL_ORIENTATION:
        CHECKSIZE(values, 6);
        values[0] = Source->OrientAt[0];
        values[1] = Source->OrientAt[1];
        values[2] = Source->OrientAt[2];
        values[3] = Source->OrientUp[0];
        values[4] = Source->OrientUp[1];
        values[5] = Source->OrientUp[2];
        return true;

    /* 1x int */
    case AL_SOURCE_RELATIVE:
    case AL_LOOPING:
    case AL_SOURCE_STATE:
    case AL_BUFFERS_QUEUED:
    case AL_BUFFERS_PROCESSED:
    case AL_SOURCE_TYPE:
    case AL_DIRECT_FILTER_GAINHF_AUTO:
    case AL_AUXILIARY_SEND_FILTER_GAIN_AUTO:
    case AL_AUXILIARY_SEND_FILTER_GAINHF_AUTO:
    case AL_DIRECT_CHANNELS_SOFT:
    case AL_DISTANCE_MODEL:
    case AL_SOURCE_RESAMPLER_SOFT:
    case AL_SOURCE_SPATIALIZE_SOFT:
        CHECKSIZE(values, 1);
        if((err=GetSourceiv(Source, Context, prop, {ivals, 1u})) != false)
            values[0] = static_cast<double>(ivals[0]);
        return err;

    case AL_BUFFER:
    case AL_DIRECT_FILTER:
    case AL_AUXILIARY_SEND_FILTER:
    case AL_SAMPLE_OFFSET_LATENCY_SOFT:
    case AL_SAMPLE_OFFSET_CLOCK_SOFT:
        break;
    }

    ERR("Unexpected property: 0x%04x\n", prop);
    Context->setError(AL_INVALID_ENUM, "Invalid source double property 0x%04x", prop);
    return false;
}